

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

bool DivisionNegativeCornerCaseHelper<char,_unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
     ::NegativeCornerCase
               (unsigned_long_long lhs,
               SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               rhs,SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                   *result)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  char cVar3;
  ulong uVar4;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)~rhs.m_int + 1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = lhs;
  uVar4 = SUB168(auVar2 / auVar1,0);
  if (uVar4 < 0x80) {
    cVar3 = -SUB161(auVar2 / auVar1,0);
  }
  else {
    cVar3 = -0x80;
    if (uVar4 != 0x80) {
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
  }
  result->m_int = cVar3;
  return true;
}

Assistant:

SAFE_INT_NODISCARD static bool NegativeCornerCase( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        // Problem case - normal casting behavior changes meaning
        // flip rhs to positive
        // any operator casts now do the right thing
        U tmp = division_negative_negateU< T, U, sizeof(T) == 4>::div(rhs, lhs);

        if( tmp <= (U)std::numeric_limits<T>::max() )
        {
            result = SafeInt< T, E >( (T)(~(std::uint64_t)tmp + 1) );
            return true;
        }

        // Corner case
        T maxT = std::numeric_limits<T>::max();
        if( tmp == (U)maxT + 1 )
        {
            T minT = std::numeric_limits<T>::min();
            result = SafeInt< T, E >( minT );
            return true;
        }

        E::SafeIntOnOverflow();
    }